

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * cuddBddClosestCube(DdManager *dd,DdNode *f,DdNode *g,double bound)

{
  DdManager *pDVar1;
  DdManager *pDVar2;
  DdNode *pDVar3;
  DdNode *local_130;
  DdNode *local_128;
  double local_120;
  DdNode *local_118;
  double local_110;
  DdNode *local_108;
  uint local_100;
  uint local_fc;
  DdNode *et;
  DdNode *te;
  uint index;
  uint topg;
  uint topf;
  DdNode *azero;
  DdNode *lzero;
  DdNode *one;
  double det;
  double dte;
  double dee;
  double dtt;
  double minD;
  DdNode *cet;
  DdNode *cte;
  DdNode *cee;
  DdNode *ctt;
  DdNode *ee;
  DdNode *tt;
  DdNode *ge;
  DdNode *gt;
  DdNode *fe;
  DdNode *ft;
  DdNode *G;
  DdNode *F;
  DdNode *res;
  double bound_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  pDVar1 = (DdManager *)dd->one;
  pDVar2 = (DdManager *)dd->zero;
  dd_local = pDVar2;
  if (((((double)(f == (DdNode *)((ulong)g ^ 1)) <= bound) && (g != (DdNode *)((ulong)pDVar1 ^ 1)))
      && (f != (DdNode *)((ulong)pDVar1 ^ 1))) &&
     (((DdManager *)f != pDVar1 || (dd_local = pDVar1, (DdManager *)g != pDVar1)))) {
    G = (DdNode *)((ulong)f & 0xfffffffffffffffe);
    ft = (DdNode *)((ulong)g & 0xfffffffffffffffe);
    res = (DdNode *)bound;
    bound_local = (double)g;
    g_local = f;
    f_local = &dd->sentinel;
    if ((G->ref != 1) || (ft->ref != 1)) {
      pDVar3 = cuddCacheLookup2(dd,Cudd_bddClosestCube,f,g);
      if (pDVar3 != (DdNode *)0x0) {
        return pDVar3;
      }
      F = (DdNode *)0x0;
    }
    if (G->index == 0x7fffffff) {
      local_fc = G->index;
    }
    else {
      local_fc = *(uint *)(f_local[7].Id + (ulong)G->index * 4);
    }
    if (ft->index == 0x7fffffff) {
      local_100 = ft->index;
    }
    else {
      local_100 = *(uint *)(f_local[7].Id + (ulong)ft->index * 4);
    }
    if (local_100 < local_fc) {
      te._4_4_ = ft->index;
      gt = g_local;
      fe = g_local;
    }
    else {
      te._4_4_ = G->index;
      fe = (G->type).kids.T;
      gt = (G->type).kids.E;
      if (((ulong)g_local & 1) != 0) {
        fe = (DdNode *)((ulong)fe ^ 1);
        gt = (DdNode *)((ulong)gt ^ 1);
      }
    }
    if (local_fc < local_100) {
      tt = (DdNode *)bound_local;
      ge = (DdNode *)bound_local;
    }
    else {
      ge = (ft->type).kids.T;
      tt = (ft->type).kids.E;
      if (((ulong)bound_local & 1) != 0) {
        ge = (DdNode *)((ulong)ge ^ 1);
        tt = (DdNode *)((ulong)tt ^ 1);
      }
    }
    ee = cuddBddClosestCube((DdManager *)f_local,fe,ge,(double)res);
    if (ee == (DdNode *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)ee & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)ee & 0xfffffffffffffffe) + 4) + 1;
      cee = separateCube((DdManager *)f_local,ee,&dee);
      if (cee == (DdNode *)0x0) {
        Cudd_RecursiveDeref((DdManager *)f_local,ee);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)cee & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)cee & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref((DdManager *)f_local,ee);
        dtt = dee;
        if ((double)res <= dee) {
          local_108 = res;
        }
        else {
          local_108 = (DdNode *)dee;
        }
        res = local_108;
        ctt = cuddBddClosestCube((DdManager *)f_local,gt,tt,(double)local_108);
        if (ctt == (DdNode *)0x0) {
          Cudd_RecursiveDeref((DdManager *)f_local,cee);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)ctt & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)ctt & 0xfffffffffffffffe) + 4) + 1;
          cte = separateCube((DdManager *)f_local,ctt,&dte);
          if (cte == (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)f_local,cee);
            Cudd_RecursiveDeref((DdManager *)f_local,ctt);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)cte & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)cte & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref((DdManager *)f_local,ctt);
            if (dee <= dte) {
              local_110 = dee;
            }
            else {
              local_110 = dte;
            }
            dtt = local_110;
            if (local_110 <= 2147483647.0) {
              if ((double)res <= local_110 - 1.0) {
                local_118 = res;
              }
              else {
                local_118 = (DdNode *)(local_110 - 1.0);
              }
              res = local_118;
            }
            if ((local_110 <= 0.0) || (local_fc != local_100)) {
              *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
              det = 2147483648.0;
              cet = (DdNode *)pDVar2;
            }
            else {
              pDVar3 = cuddBddClosestCube((DdManager *)f_local,fe,tt,(double)res - 1.0);
              if (pDVar3 == (DdNode *)0x0) {
                Cudd_RecursiveDeref((DdManager *)f_local,cee);
                Cudd_RecursiveDeref((DdManager *)f_local,cte);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
              cet = separateCube((DdManager *)f_local,pDVar3,&det);
              if (cet == (DdNode *)0x0) {
                Cudd_RecursiveDeref((DdManager *)f_local,cee);
                Cudd_RecursiveDeref((DdManager *)f_local,cte);
                Cudd_RecursiveDeref((DdManager *)f_local,pDVar3);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)cet & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)cet & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDeref((DdManager *)f_local,pDVar3);
              det = det + 1.0;
              local_120 = det;
              if (dtt <= det) {
                local_120 = dtt;
              }
              dtt = local_120;
            }
            if (dtt <= 2147483647.0) {
              if ((double)res <= dtt - 1.0) {
                local_128 = res;
              }
              else {
                local_128 = (DdNode *)(dtt - 1.0);
              }
              res = local_128;
            }
            if ((dtt <= 0.0) || (local_fc != local_100)) {
              *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
              one = (DdNode *)0x41e0000000000000;
              minD = (double)pDVar2;
            }
            else {
              pDVar3 = cuddBddClosestCube((DdManager *)f_local,gt,ge,(double)res - 1.0);
              if (pDVar3 == (DdNode *)0x0) {
                Cudd_RecursiveDeref((DdManager *)f_local,cee);
                Cudd_RecursiveDeref((DdManager *)f_local,cte);
                Cudd_RecursiveDeref((DdManager *)f_local,cet);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
              minD = (double)separateCube((DdManager *)f_local,pDVar3,(double *)&one);
              if ((DdNode *)minD == (DdNode *)0x0) {
                Cudd_RecursiveDeref((DdManager *)f_local,cee);
                Cudd_RecursiveDeref((DdManager *)f_local,cte);
                Cudd_RecursiveDeref((DdManager *)f_local,cet);
                Cudd_RecursiveDeref((DdManager *)f_local,pDVar3);
                return (DdNode *)0x0;
              }
              *(int *)(((ulong)minD & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)minD & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDeref((DdManager *)f_local,pDVar3);
              one = (DdNode *)((double)one + 1.0);
              local_130 = one;
              if (dtt <= (double)one) {
                local_130 = (DdNode *)dtt;
              }
              dtt = (double)local_130;
            }
            if ((dtt != dee) || (NAN(dtt) || NAN(dee))) {
              if ((dtt != dte) || (NAN(dtt) || NAN(dte))) {
                if ((dtt != det) || (NAN(dtt) || NAN(det))) {
                  if (local_fc != local_100) {
                    __assert_fail("topf == topg",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                  ,0x708,
                                  "DdNode *cuddBddClosestCube(DdManager *, DdNode *, DdNode *, double)"
                                 );
                  }
                  F = createResult((DdManager *)f_local,te._4_4_,0,(DdNode *)minD,(double)one);
                }
                else {
                  if (local_fc != local_100) {
                    __assert_fail("topf == topg",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                  ,0x703,
                                  "DdNode *cuddBddClosestCube(DdManager *, DdNode *, DdNode *, double)"
                                 );
                  }
                  F = createResult((DdManager *)f_local,te._4_4_,1,cet,det);
                }
              }
              else {
                F = createResult((DdManager *)f_local,te._4_4_,0,cte,dte);
              }
            }
            else if (((dee != dte) || (NAN(dee) || NAN(dte))) || (cee != cte)) {
              F = createResult((DdManager *)f_local,te._4_4_,1,cee,dee);
            }
            else {
              F = createResult((DdManager *)f_local,0x7fffffff,1,cee,dee);
            }
            if (F == (DdNode *)0x0) {
              Cudd_RecursiveDeref((DdManager *)f_local,cee);
              Cudd_RecursiveDeref((DdManager *)f_local,cte);
              Cudd_RecursiveDeref((DdManager *)f_local,cet);
              Cudd_RecursiveDeref((DdManager *)f_local,(DdNode *)minD);
              dd_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)F & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)F & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDeref((DdManager *)f_local,cee);
              Cudd_RecursiveDeref((DdManager *)f_local,cte);
              Cudd_RecursiveDeref((DdManager *)f_local,cet);
              Cudd_RecursiveDeref((DdManager *)f_local,(DdNode *)minD);
              if (((G->ref != 1) || (ft->ref != 1)) && ((DdManager *)F != pDVar2)) {
                cuddCacheInsert2((DdManager *)f_local,Cudd_bddClosestCube,g_local,
                                 (DdNode *)bound_local,F);
              }
              *(int *)(((ulong)F & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)F & 0xfffffffffffffffe) + 4) + -1;
              dd_local = (DdManager *)F;
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddBddClosestCube(
  DdManager *dd,
  DdNode *f,
  DdNode *g,
  CUDD_VALUE_TYPE bound)
{
    DdNode *res, *F, *G, *ft, *fe, *gt, *ge, *tt, *ee;
    DdNode *ctt, *cee, *cte, *cet;
    CUDD_VALUE_TYPE minD, dtt, dee, dte, det;
    DdNode *one = DD_ONE(dd);
    DdNode *lzero = Cudd_Not(one);
    DdNode *azero = DD_ZERO(dd);
    unsigned int topf, topg, index;

    statLine(dd);
    if (bound < (int)(f == Cudd_Not(g))) return(azero);
    /* Terminal cases. */
    if (g == lzero || f == lzero) return(azero);
    if (f == one && g == one) return(one);

    /* Check cache. */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    if (F->ref != 1 || G->ref != 1) {
        res = cuddCacheLookup2(dd,(DD_CTFP) Cudd_bddClosestCube, f, g);
        if (res != NULL) return(res);
    }

    topf = cuddI(dd,F->index);
    topg = cuddI(dd,G->index);

    /* Compute cofactors. */
    if (topf <= topg) {
        index = F->index;
        ft = cuddT(F);
        fe = cuddE(F);
        if (Cudd_IsComplement(f)) {
            ft = Cudd_Not(ft);
            fe = Cudd_Not(fe);
        }
    } else {
        index = G->index;
        ft = fe = f;
    }

    if (topg <= topf) {
        gt = cuddT(G);
        ge = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gt = Cudd_Not(gt);
            ge = Cudd_Not(ge);
        }
    } else {
        gt = ge = g;
    }

    tt = cuddBddClosestCube(dd,ft,gt,bound);
    if (tt == NULL) return(NULL);
    cuddRef(tt);
    ctt = separateCube(dd,tt,&dtt);
    if (ctt == NULL) {
        Cudd_RecursiveDeref(dd, tt);
        return(NULL);
    }
    cuddRef(ctt);
    Cudd_RecursiveDeref(dd, tt);
    minD = dtt;
    bound = ddMin(bound,minD);

    ee = cuddBddClosestCube(dd,fe,ge,bound);
    if (ee == NULL) {
        Cudd_RecursiveDeref(dd, ctt);
        return(NULL);
    }
    cuddRef(ee);
    cee = separateCube(dd,ee,&dee);
    if (cee == NULL) {
        Cudd_RecursiveDeref(dd, ctt);
        Cudd_RecursiveDeref(dd, ee);
        return(NULL);
    }
    cuddRef(cee);
    Cudd_RecursiveDeref(dd, ee);
    minD = ddMin(dtt, dee);
    if (minD <= CUDD_CONST_INDEX) bound = ddMin(bound,minD-1);

    if (minD > 0 && topf == topg) {
        DdNode *te = cuddBddClosestCube(dd,ft,ge,bound-1);
        if (te == NULL) {
            Cudd_RecursiveDeref(dd, ctt);
            Cudd_RecursiveDeref(dd, cee);
            return(NULL);
        }
        cuddRef(te);
        cte = separateCube(dd,te,&dte);
        if (cte == NULL) {
            Cudd_RecursiveDeref(dd, ctt);
            Cudd_RecursiveDeref(dd, cee);
            Cudd_RecursiveDeref(dd, te);
            return(NULL);
        }
        cuddRef(cte);
        Cudd_RecursiveDeref(dd, te);
        dte += 1.0;
        minD = ddMin(minD, dte);
    } else {
        cte = azero;
        cuddRef(cte);
        dte = CUDD_CONST_INDEX + 1.0;
    }
    if (minD <= CUDD_CONST_INDEX) bound = ddMin(bound,minD-1);

    if (minD > 0 && topf == topg) {
        DdNode *et = cuddBddClosestCube(dd,fe,gt,bound-1);
        if (et == NULL) {
            Cudd_RecursiveDeref(dd, ctt);
            Cudd_RecursiveDeref(dd, cee);
            Cudd_RecursiveDeref(dd, cte);
            return(NULL);
        }
        cuddRef(et);
        cet = separateCube(dd,et,&det);
        if (cet == NULL) {
            Cudd_RecursiveDeref(dd, ctt);
            Cudd_RecursiveDeref(dd, cee);
            Cudd_RecursiveDeref(dd, cte);
            Cudd_RecursiveDeref(dd, et);
            return(NULL);
        }
        cuddRef(cet);
        Cudd_RecursiveDeref(dd, et);
        det += 1.0;
        minD = ddMin(minD, det);
    } else {
        cet = azero;
        cuddRef(cet);
        det = CUDD_CONST_INDEX + 1.0;
    }

    if (minD == dtt) {
        if (dtt == dee && ctt == cee) {
            res = createResult(dd,CUDD_CONST_INDEX,1,ctt,dtt);
        } else {
            res = createResult(dd,index,1,ctt,dtt);
        }
    } else if (minD == dee) {
        res = createResult(dd,index,0,cee,dee);
    } else if (minD == dte) {
#ifdef DD_DEBUG
        assert(topf == topg);
#endif
        res = createResult(dd,index,1,cte,dte);
    } else {
#ifdef DD_DEBUG
        assert(topf == topg);
#endif
        res = createResult(dd,index,0,cet,det);
    }
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, ctt);
        Cudd_RecursiveDeref(dd, cee);
        Cudd_RecursiveDeref(dd, cte);
        Cudd_RecursiveDeref(dd, cet);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, ctt);
    Cudd_RecursiveDeref(dd, cee);
    Cudd_RecursiveDeref(dd, cte);
    Cudd_RecursiveDeref(dd, cet);

    /* Only cache results that are different from azero to avoid
    ** storing results that depend on the value of the bound. */
    if ((F->ref != 1 || G->ref != 1) && res != azero)
        cuddCacheInsert2(dd,(DD_CTFP) Cudd_bddClosestCube, f, g, res);

    cuddDeref(res);
    return(res);

}